

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O2

int dfft_create_plan_common
              (dfft_plan *p,int ndim,int *gdim,int *inembed,int *oembed,int *pdim,int *pidx,
              int row_m,int input_cyclic,int output_cyclic,MPI_Comm comm,int *proc_map,int device)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  plan_t *ppVar11;
  int **ppiVar12;
  void *pvVar13;
  ulong uVar14;
  size_t sVar15;
  int iVar16;
  ulong uVar17;
  size_t sVar18;
  size_t size;
  int iVar19;
  int nump;
  
  p->comm = comm;
  MPI_Comm_size(comm,&nump);
  if ((nump & nump - 1U) == 0) {
    sVar18 = (long)nump << 2;
    piVar6 = (int *)malloc(sVar18);
    p->proc_map = piVar6;
    memcpy(piVar6,proc_map,sVar18);
    lVar7 = (long)ndim;
    sVar15 = lVar7 * 4;
    piVar6 = (int *)malloc(sVar15);
    p->pdim = piVar6;
    piVar8 = (int *)malloc(sVar15);
    p->gdim = piVar8;
    piVar9 = (int *)malloc(sVar15);
    p->pidx = piVar9;
    piVar9 = (int *)malloc(sVar15);
    p->inembed = piVar9;
    piVar10 = (int *)malloc(sVar15);
    p->oembed = piVar10;
    p->ndim = ndim;
    uVar14 = 0;
    uVar17 = 0;
    if (0 < ndim) {
      uVar17 = (ulong)(uint)ndim;
    }
    for (; uVar17 != uVar14; uVar14 = uVar14 + 1) {
      uVar3 = gdim[uVar14];
      piVar8[uVar14] = uVar3;
      if ((uVar3 & uVar3 - 1) != 0) {
        return 5;
      }
      piVar6[uVar14] = pdim[uVar14];
    }
    if (inembed == (int *)0x0) {
      for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
        piVar9[uVar14] = piVar8[uVar14] / piVar6[uVar14];
      }
    }
    else {
      for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
        piVar9[uVar14] = inembed[uVar14];
      }
    }
    if (oembed == (int *)0x0) {
      for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
        piVar10[uVar14] = piVar8[uVar14] / piVar6[uVar14];
      }
    }
    else {
      for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
        piVar10[uVar14] = oembed[uVar14];
      }
    }
    piVar6 = (int *)malloc(sVar18);
    p->offset_send = piVar6;
    piVar6 = (int *)malloc(sVar18);
    p->offset_recv = piVar6;
    piVar6 = (int *)malloc(sVar18);
    p->nsend = piVar6;
    piVar6 = (int *)malloc(sVar18);
    p->nrecv = piVar6;
    if (device == 0) {
      sVar18 = lVar7 * 0x18;
      ppVar11 = (plan_t *)malloc(sVar18);
      p->plans_short_forward = ppVar11;
      ppVar11 = (plan_t *)malloc(sVar18);
      p->plans_long_forward = ppVar11;
      ppVar11 = (plan_t *)malloc(sVar18);
      p->plans_short_inverse = ppVar11;
      ppVar11 = (plan_t *)malloc(sVar18);
      p->plans_long_inverse = ppVar11;
    }
    iVar2 = *gdim;
    iVar16 = *pdim;
    *piVar9 = iVar2 / iVar16;
    *piVar10 = iVar2 / iVar16;
    iVar2 = 1;
    iVar16 = 1;
    for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
      iVar16 = iVar16 * piVar9[uVar14];
      iVar2 = iVar2 * piVar10[uVar14];
    }
    p->size_in = iVar16;
    p->size_out = iVar2;
    piVar6 = (int *)malloc(sVar15);
    p->k0 = piVar6;
    for (uVar14 = 0; uVar14 != uVar17; uVar14 = uVar14 + 1) {
      uVar3 = gdim[uVar14];
      lVar1 = (long)(int)uVar3;
      iVar2 = (int)(lVar1 / (long)pdim[uVar14]);
      uVar4 = 1;
      if (1 < iVar2) {
        for (; uVar4 = uVar3, iVar2 < (int)uVar3;
            uVar3 = (uint)((ulong)uVar3 / (lVar1 / (long)pdim[uVar14] & 0xffffffffU))) {
        }
      }
      piVar6[uVar14] = uVar4;
    }
    sVar15 = lVar7 << 3;
    ppiVar12 = (int **)malloc(sVar15);
    p->rho_L = ppiVar12;
    ppiVar12 = (int **)malloc(sVar15);
    p->rho_pk0 = ppiVar12;
    ppiVar12 = (int **)malloc(sVar15);
    p->rho_Lk0 = ppiVar12;
    for (lVar7 = 0; uVar17 * 4 != lVar7; lVar7 = lVar7 + 4) {
      iVar2 = *(int *)((long)pdim + lVar7);
      uVar14 = (long)*(int *)((long)gdim + lVar7) / (long)iVar2;
      iVar5 = (int)uVar14;
      pvVar13 = malloc((long)iVar5 * 4);
      *(void **)((long)p->rho_L + lVar7 * 2) = pvVar13;
      pvVar13 = malloc((ulong)((long)iVar2 << 2) / (ulong)(long)*(int *)((long)p->k0 + lVar7));
      *(void **)((long)p->rho_pk0 + lVar7 * 2) = pvVar13;
      pvVar13 = malloc((ulong)((long)iVar5 * 4) / (ulong)(long)*(int *)((long)p->k0 + lVar7));
      *(void **)((long)p->rho_Lk0 + lVar7 * 2) = pvVar13;
      bitrev_init(iVar5,*(int **)((long)p->rho_L + lVar7 * 2));
      bitrev_init(*(int *)((long)pdim + lVar7) / *(int *)((long)p->k0 + lVar7),
                  *(int **)((long)p->rho_pk0 + lVar7 * 2));
      bitrev_init((int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
                       (long)*(int *)((long)p->k0 + lVar7)),*(int **)((long)p->rho_Lk0 + lVar7 * 2))
      ;
    }
    for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
      p->pidx[uVar14] = pidx[uVar14];
    }
    if (device == 0) {
      iVar2 = dfft_init_local_fft();
      if (iVar2 == 0) {
        p->dfft_multi = 0;
        p->device = 0;
        lVar7 = 0;
        iVar2 = 1;
        for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
          iVar19 = (gdim[uVar14] / pdim[uVar14]) * (iVar16 / p->inembed[uVar14]);
          iVar5 = iVar19 / p->k0[uVar14];
          dfft_create_1d_plan((plan_t *)((long)&p->plans_short_forward->n + lVar7),p->k0[uVar14],1,
                              iVar5,1,iVar5,1,0);
          iVar5 = iVar19 / p->k0[uVar14];
          dfft_create_1d_plan((plan_t *)((long)&p->plans_short_inverse->n + lVar7),p->k0[uVar14],1,
                              iVar5,1,iVar5,1,1);
          iVar5 = gdim[uVar14] / pdim[uVar14];
          iVar19 = iVar19 / iVar5;
          dfft_create_1d_plan((plan_t *)((long)&p->plans_long_forward->n + lVar7),iVar5,1,iVar19,1,
                              iVar19,1,0);
          dfft_create_1d_plan((plan_t *)((long)&p->plans_long_inverse->n + lVar7),iVar5,1,iVar19,1,
                              iVar19,1,1);
          iVar16 = (iVar16 / p->inembed[uVar14]) * p->oembed[uVar14];
          lVar7 = lVar7 + 0x18;
        }
        for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
          iVar16 = p->oembed[uVar14];
          if (p->oembed[uVar14] < p->inembed[uVar14]) {
            iVar16 = p->inembed[uVar14];
          }
          iVar2 = iVar2 * iVar16;
        }
        p->scratch_size = iVar2;
        size = (long)iVar2 << 3;
        dfft_allocate_aligned_memory(&p->scratch,size);
        dfft_allocate_aligned_memory(&p->scratch_2,size);
        dfft_allocate_aligned_memory(&p->scratch_3,size);
        p->input_cyclic = input_cyclic;
        p->output_cyclic = output_cyclic;
        p->row_m = row_m;
        p->init = 1;
        iVar2 = 0;
      }
      else {
        iVar2 = 1;
      }
    }
    else {
      iVar2 = 2;
    }
  }
  else {
    iVar2 = 4;
  }
  return iVar2;
}

Assistant:

int dfft_create_plan_common(dfft_plan *p,
    int ndim, int *gdim,
    int *inembed, int *oembed,
    int *pdim, int *pidx, int row_m,
    int input_cyclic, int output_cyclic,
    MPI_Comm comm,
    int *proc_map,
    int device)
    {
    int s,nump;

    p->comm = comm;

    MPI_Comm_size(comm,&nump);

    /* number of processor must be power of two */
    if (nump & (nump-1)) return 4;

    /* Allocate memory for processor map and copy over */
    p->proc_map = malloc(sizeof(int)*nump);
    memcpy(p->proc_map, proc_map, sizeof(int)*nump);

    p->pdim = malloc(ndim*sizeof(int));
    p->gdim = malloc(ndim*sizeof(int));
    p->pidx = malloc(ndim*sizeof(int));

    p->inembed = malloc(ndim*sizeof(int));
    p->oembed = malloc(ndim*sizeof(int));

    p->ndim = ndim;

    int i;
    for (i = 0; i < ndim; i++)
        {
        p->gdim[i] = gdim[i];

        /* Every dimension must be a power of two */
        if (gdim[i] & (gdim[i]-1)) return 5;

        p->pdim[i] = pdim[i];
        }

    if (inembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = inembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->inembed[i] = p->gdim[i]/p->pdim[i];
        }

    if (oembed != NULL)
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = oembed[i];
        }
    else
        {
        for (i = 0; i < ndim; i++)
            p->oembed[i] = p->gdim[i]/p->pdim[i];
        }

    p->offset_send = (int *)malloc(sizeof(int)*nump);
    p->offset_recv = (int *)malloc(sizeof(int)*nump);
    p->nsend = (int *)malloc(sizeof(int)*nump);
    p->nrecv = (int *)malloc(sizeof(int)*nump);

    if (!device)
        {
        #ifdef ENABLE_HOST
        p->plans_short_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_long_forward = malloc(sizeof(plan_t)*ndim);
        p->plans_short_inverse = malloc(sizeof(plan_t)*ndim);
        p->plans_long_inverse = malloc(sizeof(plan_t)*ndim);
        #else
        return 3;
        #endif
        }

    /* local problem size */
    int size_in = 1;
    int size_out = 1;

    /* since we expect column-major input, the leading dimension
      has no embedding */
    p->inembed[0] = gdim[0]/pdim[0];
    p->oembed[0] = gdim[0]/pdim[0];

    for (i = 0; i < ndim ; ++i)
        {
        size_in *= p->inembed[i];
        size_out *= p->oembed[i];
        }

    p->size_in = size_in;
    p->size_out = size_out;

    /* find length k0 of last stage of butterflies */
    p->k0 = malloc(sizeof(int)*ndim);

    for (i = 0; i< ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        if (length > 1)
            {
            int c;
            for (c=gdim[i]; c>length; c /= length)
                ;
            p->k0[i] = c;
            }
        else
            {
            p->k0[i] = 1;
            }
        }

    p->rho_L = (int **)malloc(ndim*sizeof(int *));
    p->rho_pk0= (int **)malloc(ndim*sizeof(int *));
    p->rho_Lk0 = (int **)malloc(ndim*sizeof(int *));

    for (i = 0; i < ndim; ++i)
        {
        int length = gdim[i]/pdim[i];
        p->rho_L[i] = (int *) malloc(sizeof(int)*length);
        p->rho_pk0[i] = (int *) malloc(sizeof(int)*pdim[i]/(p->k0[i]));
        p->rho_Lk0[i] = (int *) malloc(sizeof(int)*length/(p->k0[i]));
        bitrev_init(length, p->rho_L[i]);
        bitrev_init(pdim[i]/(p->k0[i]),p->rho_pk0[i]);
        bitrev_init(length/(p->k0[i]),p->rho_Lk0[i]);
        }

    /* processor coordinates */
    for (i = 0; i < ndim; ++i)
        {
        p->pidx[i] = pidx[i];
        }

    /* init local FFT library */
    int res;
    if (!device)
        {
        #ifdef ENABLE_HOST
        res = dfft_init_local_fft();
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        res = dfft_cuda_init_local_fft();
        #else
        return 2;
        #endif
        }

    if (res) return 1;

    int size = size_in;

    p->dfft_multi = 0;

    p->device = device;

    if (device)
        {
        /* use multidimensional local transforms */
        dfft_create_execution_flow(p);

        /* allocate storage for variables */
        int dmax = p->max_depth + 2;
        p->rev_j1 = (int **) malloc(sizeof(int *)*dmax);
        p->rev_global = (int **) malloc(sizeof(int *)*dmax);
        p->rev_partial = (int **) malloc(sizeof(int *)*dmax);
        p->c0 = (int **) malloc(sizeof(int *)*dmax);
        p->c1 = (int **) malloc(sizeof(int *)*dmax);
        int d;
        for (d = 0; d < dmax; ++d)
            {
            p->rev_j1[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_global[d] = (int *) malloc(sizeof(int)*ndim);
            p->rev_partial[d] = (int *) malloc(sizeof(int)*ndim);
            p->c0[d] = (int *) malloc(sizeof(int)*ndim);
            p->c1[d] = (int *) malloc(sizeof(int)*ndim);
            }

        p->dfft_multi = 1;
        }
    else
        {
        for (i = 0; i < ndim; ++i)
            {
            /* plan for short-distance butterflies */
            int st = size/p->inembed[i]*(gdim[i]/pdim[i]);

            #ifdef ENABLE_HOST
            int howmany = 1;
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/(p->k0[i]);
            #endif
            dfft_create_1d_plan(&(p->plans_short_forward[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 0);
            dfft_create_1d_plan(&(p->plans_short_inverse[i]),p->k0[i],
                howmany, st/(p->k0[i]), 1, st/(p->k0[i]), 1, 1);

            /* plan for long-distance butterflies */
            int length = gdim[i]/pdim[i];
            #ifdef FFT1D_SUPPORTS_THREADS
            howmany = st/length;
            #endif
            dfft_create_1d_plan(&(p->plans_long_forward[i]), length,
                howmany, st/length,1, st/length,1, 0);
            dfft_create_1d_plan(&(p->plans_long_inverse[i]), length,
                howmany, st/length,1, st/length,1, 1);
            #else
            return 3;
            #endif

            size /= p->inembed[i];
            size *= p->oembed[i];
            }
        }

    /* Allocate scratch space */
    int scratch_size = 1;
    for (i = 0; i < ndim; ++i)
        scratch_size *= ((p->inembed[i] > p->oembed[i]) ? p->inembed[i]  : p->oembed[i]);
    p->scratch_size = scratch_size;

    if (!device)
        {
        #ifdef ENABLE_HOST
        dfft_allocate_aligned_memory(&(p->scratch),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_2),sizeof(cpx_t)*scratch_size);
        dfft_allocate_aligned_memory(&(p->scratch_3),sizeof(cpx_t)*scratch_size);
        #else
        return 3;
        #endif
        }
    else
        {
        #ifdef ENABLE_CUDA
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_2),sizeof(cuda_cpx_t)*scratch_size);
        dfft_cuda_allocate_aligned_memory(&(p->d_scratch_3),sizeof(cuda_cpx_t)*scratch_size);
        #else
        return 2;
        #endif
        }

    p->input_cyclic = input_cyclic;
    p->output_cyclic = output_cyclic;

    #ifdef ENABLE_CUDA
    #ifndef NDEBUG
    p->check_cuda_errors = 1;
    #else
    p->check_cuda_errors = 0;
    #endif
    #endif

    p->row_m = row_m;

    /* before plan creation is complete, an initialization run will
     * be performed */
    p->init = 1;

    return 0;
    }